

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jzon.cpp
# Opt level: O1

void __thiscall Jzon::Node::clear(Node *this)

{
  Data *pDVar1;
  
  pDVar1 = this->data;
  if ((pDVar1 != (Data *)0x0) &&
     ((pDVar1->children).
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jzon::Node>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jzon::Node>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pDVar1->children).
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jzon::Node>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jzon::Node>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    detach(this);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jzon::Node>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jzon::Node>_>_>
    ::_M_erase_at_end(&this->data->children,
                      (this->data->children).
                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jzon::Node>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jzon::Node>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    return;
  }
  return;
}

Assistant:

void Node::clear()
	{
		if (data != NULL && !data->children.empty())
		{
			detach();
			data->children.clear();
		}
	}